

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O3

fdb_status wal_copyto_snapshot(filemgr *file,snap_handle *shandle,bool is_multi_kv)

{
  fdb_txn *pfVar1;
  fdb_txn *pfVar2;
  avl_node *paVar3;
  avl_node *node;
  fdb_txn *pfVar4;
  list_elem *plVar5;
  avl_node *paVar6;
  ulong __size;
  size_t sVar7;
  fdb_kvs_id_t kv_id;
  fdb_doc doc;
  fdb_kvs_id_t local_a0;
  filemgr *local_98;
  size_t local_90;
  size_t local_88;
  fdb_doc local_80;
  
  local_a0 = 0;
  local_90 = file->wal->num_shards;
  (shandle->stat).wal_ndocs = 0;
  (shandle->stat).wal_ndeletes = 0;
  if (local_90 != 0) {
    pfVar1 = &file->global_txn;
    sVar7 = 0;
    local_98 = file;
    do {
      local_88 = sVar7;
      pthread_spin_lock(&file->wal->key_shards[sVar7].lock);
      node = avl_first(&file->wal->key_shards[sVar7]._map);
      file = local_98;
      sVar7 = local_88;
      while (local_98 = file, local_88 = sVar7, node != (avl_node *)0x0) {
        if ((!is_multi_kv) ||
           (buf2kvid((ulong)*(byte *)((long)&node[1].left + 2),node[1].parent,&local_a0),
           local_a0 == shandle->id)) {
          for (paVar6 = node[1].right; paVar6 != (avl_node *)0x0; paVar6 = paVar6->left) {
            if (((ulong)paVar6[3].parent & 0x100) == 0) {
              pfVar2 = (fdb_txn *)paVar6[2].parent;
              pfVar4 = shandle->snap_txn;
              if ((pfVar2 == pfVar1) || (pfVar4 = pfVar2, pfVar2 == shandle->snap_txn))
              goto LAB_0014f7fc;
            }
            else {
              pfVar4 = shandle->snap_txn;
LAB_0014f7fc:
              if ((((ulong)paVar6[3].parent & 0x100) != 0) &&
                 ((((fdb_txn *)paVar6[2].parent != shandle->global_txn &&
                   ((fdb_txn *)paVar6[2].parent != pfVar4)) &&
                  (plVar5 = (shandle->active_txn_list).head, plVar5 != (list_elem *)0x0)))) {
                do {
                  if ((avl_node *)plVar5[1].prev == paVar6[2].left) goto LAB_0014f815;
                  plVar5 = plVar5->next;
                } while (plVar5 != (list_elem *)0x0);
              }
              if (paVar6[3].right <= (avl_node *)shandle->seqnum) {
                paVar3 = paVar6[1].right;
                __size = (ulong)*(ushort *)&paVar3[1].left;
                local_80.keylen = __size;
                local_80.key = malloc(__size);
                memcpy(local_80.key,paVar3[1].parent,__size);
                local_80.seqnum = (fdb_seqnum_t)paVar6[3].right;
                local_80.deleted = (byte)(*(wal_item_action *)&paVar6[3].parent - 1) < 2;
                wal_snap_insert(shandle,&local_80,(uint64_t)paVar6[3].left,
                                *(wal_item_action *)&paVar6[3].parent);
                break;
              }
            }
LAB_0014f815:
          }
        }
        node = avl_next(node);
        file = local_98;
        sVar7 = local_88;
      }
      pthread_spin_unlock(&file->wal->key_shards[sVar7].lock);
      sVar7 = sVar7 + 1;
    } while (sVar7 != local_90);
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status wal_copyto_snapshot(struct filemgr *file,
                               struct snap_handle *shandle,
                               bool is_multi_kv)
{
    struct list_elem *ee;
    struct avl_node *a;
    struct wal_item *item;
    struct wal_item_header *header;
    fdb_kvs_id_t kv_id = 0;
    fdb_doc doc;
    size_t i = 0;
    size_t num_shards = file->wal->num_shards;

    shandle->stat.wal_ndocs = 0; // WAL copy will populate
    shandle->stat.wal_ndeletes = 0; // these 2 stats

    // Get the list of active transactions now
    for (; i < num_shards; ++i) {
        spin_lock(&file->wal->key_shards[i].lock);
        a = avl_first(&file->wal->key_shards[i]._map);
        while (a) {
            header = _get_entry(a, struct wal_item_header, avl_key);
            if (is_multi_kv) {
                buf2kvid(header->chunksize, header->key, &kv_id);
                if (kv_id != shandle->id) {
                    a = avl_next(a);
                    continue;
                }
            }
            ee = list_begin(&header->items);
            while (ee) {
                item = _get_entry(ee, struct wal_item, list_elem);
                // Skip any uncommitted item, if not part of either global or
                // the current transaction
                if (!(item->flag & WAL_ITEM_COMMITTED) &&
                        item->txn != &file->global_txn &&
                        item->txn != shandle->snap_txn) {
                    ee = list_next(ee);
                    continue;
                }
                // Skip the partially committed items too.
                if (_wal_item_partially_committed(shandle->global_txn,
                                                  &shandle->active_txn_list,
                                                  shandle->snap_txn, item)) {
                    ee = list_next(ee);
                    continue;
                }

                if (item->seqnum > shandle->seqnum) {
                    ee = list_next(ee);
                    continue;
                }

                doc.keylen = item->header->keylen;
                doc.key = malloc(doc.keylen); // (freed in fdb_snapshot_close)
                memcpy(doc.key, item->header->key, doc.keylen);
                doc.seqnum = item->seqnum;
                doc.deleted = (item->action == WAL_ACT_LOGICAL_REMOVE ||
                               item->action == WAL_ACT_REMOVE);
                wal_snap_insert(shandle, &doc, item->offset, item->action);
                break; // We just require a single latest copy in the snapshot
            }
            a = avl_next(a);
        }
        spin_unlock(&file->wal->key_shards[i].lock);
    }
    return FDB_RESULT_SUCCESS;
}